

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_sales.cpp
# Opt level: O1

void use_sales(void)

{
  int iVar1;
  double *pdVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  uint uVar6;
  double *pdVar7;
  byte bVar8;
  LabeledSales sales2;
  Sales sales1;
  LabeledSales ls;
  Sales sales;
  double val_s2 [12];
  double val_s1 [12];
  string local_318;
  LabeledSales local_2f8;
  Sales local_268;
  LabeledSales local_1f8;
  Sales local_168;
  double local_f8 [12];
  double local_98 [13];
  
  bVar8 = 0;
  L15_4::Sales::Sales(&local_168,0);
  pdVar2 = L15_4::Sales::operator[](&local_168,1);
  *pdVar2 = 100.0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2018 sales: ",0xc);
  pdVar2 = L15_4::Sales::operator[](&local_168,1);
  poVar3 = std::ostream::_M_insert<double>(*pdVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2018 ps: ",9);
  iVar1 = (*local_168._vptr_Sales[3])(&local_168,1);
  poVar3 = std::ostream::_M_insert<double>(*(double *)CONCAT44(extraout_var,iVar1));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pdVar2 = local_2f8.super_Sales._gross + 1;
  local_2f8.super_Sales._vptr_Sales = (_func_int **)pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"abcd","");
  L15_4::LabeledSales::LabeledSales(&local_1f8,(string *)&local_2f8,0);
  if (local_2f8.super_Sales._vptr_Sales != (_func_int **)pdVar2) {
    operator_delete(local_2f8.super_Sales._vptr_Sales);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"abcd: ",6);
  pdVar2 = L15_4::LabeledSales::operator[](&local_1f8,2);
  poVar3 = std::ostream::_M_insert<double>(*pdVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pdVar2 = (double *)&DAT_001278d0;
  pdVar7 = local_98;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar7 = *pdVar2;
    pdVar2 = pdVar2 + (ulong)bVar8 * -2 + 1;
    pdVar7 = pdVar7 + (ulong)bVar8 * -2 + 1;
  }
  pdVar2 = (double *)&DAT_00127930;
  pdVar7 = local_f8;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar7 = *pdVar2;
    pdVar2 = pdVar2 + (ulong)bVar8 * -2 + 1;
    pdVar7 = pdVar7 + (ulong)bVar8 * -2 + 1;
  }
  L15_4::Sales::Sales(&local_268,2000,local_98,0xc);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"End of the world","");
  L15_4::LabeledSales::LabeledSales(&local_2f8,&local_318,0x7dc,local_f8,0xc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"First try block:\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Year = ",7);
  plVar4 = (long *)std::ostream::operator<<(&std::cout,local_268._year);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  uVar6 = 0;
  do {
    pdVar2 = L15_4::Sales::operator[](&local_268,uVar6);
    poVar3 = std::ostream::_M_insert<double>(*pdVar2);
    local_318._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_318,1);
    if ((uVar6 / 6) * 6 + 5 == uVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Year = ",7);
  plVar4 = (long *)std::ostream::operator<<(&std::cout,local_2f8.super_Sales._year);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Label = ",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_2f8._label._M_dataplus._M_p,
                      local_2f8._label._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar6 = 0;
  do {
    pdVar2 = L15_4::LabeledSales::operator[](&local_2f8,uVar6);
    poVar3 = std::ostream::_M_insert<double>(*pdVar2);
    local_318._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_318,1);
    if ((uVar6 / 6) * 6 + 5 == uVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"End of the try block 1\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nNext try block...\n",0x13);
  pdVar2 = L15_4::LabeledSales::operator[](&local_2f8,2);
  *pdVar2 = 22222.0;
  pdVar2 = L15_4::Sales::operator[](&local_268,0x14);
  *pdVar2 = 202020.0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"End of try block 2...\n",0x16);
  local_2f8.super_Sales._vptr_Sales = (_func_int **)&PTR__LabeledSales_00134ab0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._label._M_dataplus._M_p != &local_2f8._label.field_2) {
    operator_delete(local_2f8._label._M_dataplus._M_p);
  }
  local_1f8.super_Sales._vptr_Sales = (_func_int **)&PTR__LabeledSales_00134ab0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._label._M_dataplus._M_p != &local_1f8._label.field_2) {
    operator_delete(local_1f8._label._M_dataplus._M_p);
  }
  return;
}

Assistant:

void use_sales() {
    //
    using namespace L15_4;
//    using namespace std;

    //
    Sales sales;
    sales[1] = 100;
    std::cout << "2018 sales: " << sales[1] << std::endl;

    //  allocate a pointer, points to 'sales' actual location
    Sales *ps = &sales;
    std::cout << "2018 ps: " << (*ps)[1] << std::endl;

    LabeledSales ls("abcd");
    std::cout << "abcd: " << ls[2] << std::endl;

    double val_s1[12] = {
            1001, 1002, 1003, 1004, 1005, 1006, 1007, 1008, 1009, 1010, 1011, 1012
    };

    double val_s2[12] = {
            11, 22, 33, 44, 55, 66, 77, 88, 99, 109, 121, 202,
    };

    Sales sales1(2000, val_s1, 12);
    LabeledSales sales2("End of the world", 2012, val_s2, 12);

    std::cout << "First try block:\n";
    try {
        int i;
        std::cout << "Year = " << sales1.get_year() << std::endl;
        for (i = 0; i < sales1.MONTHS; i++) {
            std::cout << sales1[i] << ' ';
            if (i % 6 == 5) {
                std::cout << "\n";
            }
        }

        std::cout << "\n";

        std::cout << "Year = " << sales2.get_year() << std::endl;
        std::cout << "Label = " << sales2.get_label() << std::endl;
        for (i = 0; i <= sales2.MONTHS; i++) {
            std::cout << sales2[i] << ' ';
            if (i % 6 == 5) {
                std::cout << "\n";
            }
        }

        std::cout << "End of the try block 1\n";
    } catch(LabeledSales::NBadIndex & error) {
        //  error.what(): something like error.message in js?
        std::cout << "Catch NBadIndex:" << error.what();
        std::cout << "Company: " << error.get_label_value() << std::endl;
        std::cout << "Bad index: " << error.get_bad_value() << std::endl;
    } catch(Sales::BadIndex & error) {
        std::cout << error.what();
        std::cout << "Bad index: " << error.get_bad_value() << std::endl;
    }

    std::cout << "\nNext try block...\n";

    try {
        sales2[2] = 22222;
        sales1[20] = 202020;
        std::cout << "End of try block 2...\n";
    } catch(LabeledSales::NBadIndex & error) {
        //  error.what(): something like error.message in js?
        std::cout << "Catch NBadIndex:" << error.what();
        std::cout << "Company: " << error.get_label_value() << std::endl;
        std::cout << "Bad index: " << error.get_bad_value() << std::endl;
    } catch(Sales::BadIndex & error) {
        std::cout << error.what();
        std::cout << "Bad index: " << error.get_bad_value() << std::endl;
    }
}